

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MenuUtils.cpp
# Opt level: O2

void showTruckList(Farm *farm)

{
  ostream *poVar1;
  pointer pTVar2;
  double dVar3;
  Truck t;
  vector<Truck,_std::allocator<Truck>_> local_68;
  string local_50;
  
  line(0x14,'-');
  poVar1 = std::operator<<((ostream *)&std::cout,"Baskets");
  std::endl<char,std::char_traits<char>>(poVar1);
  line(0x14,'-');
  Farm::getTrucks(&local_68,farm);
  for (pTVar2 = local_68.super__Vector_base<Truck,_std::allocator<Truck>_>._M_impl.
                super__Vector_impl_data._M_start;
      pTVar2 != local_68.super__Vector_base<Truck,_std::allocator<Truck>_>._M_impl.
                super__Vector_impl_data._M_finish; pTVar2 = pTVar2 + 1) {
    Truck::Truck(&t,pTVar2);
    poVar1 = std::operator<<((ostream *)&std::cout,"Truck\'s plate: ");
    Truck::getPlate_abi_cxx11_(&local_50,&t);
    poVar1 = std::operator<<(poVar1,(string *)&local_50);
    std::operator<<(poVar1," | Capacity: ");
    dVar3 = Truck::getCapacity(&t);
    poVar1 = std::ostream::_M_insert<double>(dVar3);
    std::endl<char,std::char_traits<char>>(poVar1);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::~string((string *)&t.plate);
  }
  std::vector<Truck,_std::allocator<Truck>_>::~vector(&local_68);
  line(0x14,'-');
  std::__cxx11::string::string((string *)&t,"ENTER to go back",(allocator *)&local_50);
  enterWait((string *)&t);
  std::__cxx11::string::~string((string *)&t);
  return;
}

Assistant:

void showTruckList(Farm &farm){
    line(20);
    cout << "Baskets" << endl;
    line(20);
    for (Truck t: farm.getTrucks()) {
        cout << "Truck's plate: " << t.getPlate() << " | Capacity: " << t.getCapacity() << endl;
    }
    line(20);
    enterWait();
}